

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Request::CallCompletion(Request *this,CURLcode cc)

{
  bool bVar1;
  type this_00;
  handle_t pCVar2;
  ulong uVar3;
  undefined1 local_68 [8];
  Result result;
  CURLcode cc_local;
  Request *this_local;
  
  result._76_4_ = cc;
  Result::Result((Result *)local_68,(CURLcode *)&result.field_0x4c);
  this_00 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
            operator*(&this->eh_);
  pCVar2 = EasyHandle::operator_cast_to_void_(this_00);
  curl_easy_getinfo(pCVar2,0x200002,&result);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->completion_);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&result.field_0x28,(string *)&this->default_data_buffer_);
    }
    std::function<void_(const_restincurl::Result_&)>::operator()
              (&this->completion_,(Result *)local_68);
  }
  Result::~Result((Result *)local_68);
  return;
}

Assistant:

void CallCompletion(CURLcode cc) {
            Result result(cc);

            curl_easy_getinfo (*eh_, CURLINFO_RESPONSE_CODE,
                               &result.http_response_code);
            RESTINCURL_LOG("Complete: http code: " << result.http_response_code);
            if (completion_) {
                if (!default_data_buffer_.empty()) {
                    result.body = std::move(default_data_buffer_);
                }
                completion_(result);
            }
        }